

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int __thiscall icu_63::UnicodeString::copy(UnicodeString *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  char16_t *in_RAX;
  int32_t in_ECX;
  int limit;
  int srcLength;
  int start;
  
  limit = (int)src;
  start = (int)dst;
  srcLength = limit - start;
  if (srcLength != 0 && start <= limit) {
    in_RAX = (char16_t *)uprv_malloc_63((long)srcLength * 2);
    if (in_RAX != (char16_t *)0x0) {
      extractBetween(this,start,limit,in_RAX,0);
      insert(this,in_ECX,in_RAX,0,srcLength);
      uprv_free_63(in_RAX);
      return extraout_EAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

void 
UnicodeString::copy(int32_t start, int32_t limit, int32_t dest) {
    if (limit <= start) {
        return; // Nothing to do; avoid bogus malloc call
    }
    UChar* text = (UChar*) uprv_malloc( sizeof(UChar) * (limit - start) );
    // Check to make sure text is not null.
    if (text != NULL) {
	    extractBetween(start, limit, text, 0);
	    insert(dest, text, 0, limit - start);    
	    uprv_free(text);
    }
}